

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmessage.cpp
# Opt level: O1

void __thiscall QDBusMessage::QDBusMessage(QDBusMessage *this)

{
  QDBusMessagePrivate *__s;
  
  __s = (QDBusMessagePrivate *)operator_new(0xc0);
  memset(__s,0,0xb0);
  __s->ref = (QAtomicInteger<int>)0x1;
  __s->type = InvalidMessage;
  __s->field_0xbc = __s->field_0xbc & 0xc0 | 8;
  this->d_ptr = __s;
  return;
}

Assistant:

QDBusMessage::QDBusMessage()
{
    d_ptr = new QDBusMessagePrivate;
}